

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

TStatus luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  ptrdiff_t pVar3;
  ptrdiff_t old_errfunc;
  lu_byte old_allowhooks;
  CallInfo *old_ci;
  TStatus status;
  ptrdiff_t ef_local;
  ptrdiff_t old_top_local;
  void *u_local;
  Pfunc func_local;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  pVar3 = L->errfunc;
  L->errfunc = ef;
  old_ci._7_1_ = luaD_rawrunprotected(L,func,u);
  if (old_ci._7_1_ != '\0') {
    L->ci = pCVar2;
    L->allowhook = lVar1;
    old_ci._7_1_ = luaD_closeprotected(L,old_top,old_ci._7_1_);
    luaD_seterrorobj(L,old_ci._7_1_,(StkId)((long)(L->stack).p + old_top));
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar3;
  return old_ci._7_1_;
}

Assistant:

TStatus luaD_pcall (lua_State *L, Pfunc func, void *u, ptrdiff_t old_top,
                                  ptrdiff_t ef) {
  TStatus status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (l_unlikely(status != LUA_OK)) {  /* an error occurred? */
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    status = luaD_closeprotected(L, old_top, status);
    luaD_seterrorobj(L, status, restorestack(L, old_top));
    luaD_shrinkstack(L);   /* restore stack size in case of overflow */
  }
  L->errfunc = old_errfunc;
  return status;
}